

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void FStat::PrintStat(void)

{
  FStat *pFVar1;
  long lVar2;
  int iVar3;
  int y;
  int iVar4;
  int iVar5;
  FStat **ppFVar6;
  FString stattext;
  
  iVar5 = ConFont->FontHeight + 1;
  y = (screen->super_DSimpleCanvas).super_DCanvas.Height;
  iVar4 = 0;
  ppFVar6 = &FirstStat;
  while (pFVar1 = *ppFVar6, pFVar1 != (FStat *)0x0) {
    if (pFVar1->m_Active == true) {
      (*pFVar1->_vptr_FStat[2])(&stattext,pFVar1);
      if (*(int *)(stattext.Chars + -0xc) != 0) {
        y = y - iVar5;
        for (lVar2 = 0; (uint)lVar2 < *(int *)(stattext.Chars + -0xc) - 1U; lVar2 = lVar2 + 1) {
          iVar3 = 0;
          if (stattext.Chars[lVar2] == '\n') {
            iVar3 = iVar5;
          }
          y = y - iVar3;
        }
        DCanvas::DrawText((DCanvas *)screen,ConFont,3,5,y,stattext.Chars,0);
        iVar4 = iVar4 + 1;
      }
      FString::~FString(&stattext);
    }
    ppFVar6 = &pFVar1->m_Next;
  }
  if (iVar4 != 0) {
    ST_SetNeedRefresh();
  }
  return;
}

Assistant:

void FStat::PrintStat ()
{
	int fontheight = ConFont->GetHeight() + 1;
	int y = SCREENHEIGHT;
	int count = 0;

	for (FStat *stat = FirstStat; stat != NULL; stat = stat->m_Next)
	{
		if (stat->m_Active)
		{
			FString stattext(stat->GetStats());

			if (stattext.Len() > 0)
			{
				y -= fontheight;	// there's at least one line of text
				for (unsigned i = 0; i < stattext.Len()-1; i++)
				{
					// Count number of linefeeds but ignore terminating ones.
					if (stattext[i] == '\n') y -= fontheight;
				}
				screen->DrawText(ConFont, CR_GREEN, 5, y, stattext, TAG_DONE);
				count++;
			}
		}
	}
	if (count)
	{
		ST_SetNeedRefresh();
	}
}